

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcodec_service.c
# Opt level: O0

MPP_RET vcodec_service_cmd_poll(void *ctx,MppDevPollCfg *cfg)

{
  uint uVar1;
  RK_S32 *pRVar2;
  uint *puVar3;
  int *piVar4;
  char *pcVar5;
  MPP_RET *pMVar6;
  MPP_RET local_38;
  MPP_RET ret;
  RK_S32 reg_size;
  void *reg_get;
  VcodecRegCfg *poll_cfg;
  MppDevVcodecService *p;
  MppDevPollCfg *cfg_local;
  void *ctx_local;
  
  pRVar2 = (RK_S32 *)((long)ctx + (long)*(int *)((long)ctx + 0x20) * 0xa0 + 0x28);
  local_38 = vcodec_service_ioctl
                       (*(RK_S32 *)((long)ctx + 0x10),0x40086c04,*(void **)(pRVar2 + 0x26),*pRVar2);
  if (local_38 != MPP_OK) {
    puVar3 = (uint *)__errno_location();
    uVar1 = *puVar3;
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    _mpp_log_l(2,"vcodec_service","ioctl VPU_IOC_GET_REG failed ret %d errno %d %s\n",
               "vcodec_service_cmd_poll",(ulong)(uint)local_38,(ulong)uVar1,pcVar5);
    pMVar6 = __errno_location();
    local_38 = *pMVar6;
  }
  *(int *)((long)ctx + 0x20) = *(int *)((long)ctx + 0x20) + 1;
  if (*(int *)((long)ctx + 0x14) <= *(int *)((long)ctx + 0x20)) {
    *(undefined4 *)((long)ctx + 0x20) = 0;
  }
  return local_38;
}

Assistant:

MPP_RET vcodec_service_cmd_poll(void *ctx, MppDevPollCfg *cfg)
{
    MppDevVcodecService *p = (MppDevVcodecService *)ctx;
    VcodecRegCfg *poll_cfg = &p->regs[p->reg_poll_idx];
    void *reg_get = poll_cfg->reg_get;
    RK_S32 reg_size = poll_cfg->reg_size;
    MPP_RET ret = vcodec_service_ioctl(p->fd, VPU_IOC_GET_REG,
                                       reg_get, reg_size);
    if (ret) {
        mpp_err_f("ioctl VPU_IOC_GET_REG failed ret %d errno %d %s\n",
                  ret, errno, strerror(errno));
        ret = errno;
    }

    p->reg_poll_idx++;
    if (p->reg_poll_idx >= p->max_regs)
        p->reg_poll_idx = 0;

    (void)cfg;
    return ret;
}